

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O3

void tchecker::add_accesses(typed_expression_t *expr,process_id_t pid,variable_access_map_t *map)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range1;
  __node_base _Var1;
  __node_base _Var2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  intvar_ids;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  clock_ids;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_88;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_50;
  
  local_50._M_buckets = &local_50._M_single_bucket;
  local_50._M_bucket_count = 1;
  local_50._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_50._M_element_count = 0;
  local_50._M_rehash_policy._M_max_load_factor = 1.0;
  local_50._M_rehash_policy._M_next_resize = 0;
  local_50._M_single_bucket = (__node_base_ptr)0x0;
  local_88._M_buckets = &local_88._M_single_bucket;
  local_88._M_bucket_count = 1;
  local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_88._M_element_count = 0;
  local_88._M_rehash_policy._M_max_load_factor = 1.0;
  local_88._M_rehash_policy._M_next_resize = 0;
  local_88._M_single_bucket = (__node_base_ptr)0x0;
  extract_variables(expr,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&local_50,
                    (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&local_88);
  for (_Var1._M_nxt = local_50._M_before_begin._M_nxt;
      _Var2._M_nxt = local_88._M_before_begin._M_nxt, _Var1._M_nxt != (_Hash_node_base *)0x0;
      _Var1._M_nxt = (_Var1._M_nxt)->_M_nxt) {
    variable_access_map_t::add
              (map,*(variable_id_t *)&_Var1._M_nxt[1]._M_nxt,VTYPE_CLOCK,VACCESS_READ,pid);
  }
  for (; _Var2._M_nxt != (_Hash_node_base *)0x0; _Var2._M_nxt = (_Var2._M_nxt)->_M_nxt) {
    variable_access_map_t::add
              (map,*(variable_id_t *)&_Var2._M_nxt[1]._M_nxt,VTYPE_INTVAR,VACCESS_READ,pid);
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_88);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_50);
  return;
}

Assistant:

static void add_accesses(tchecker::typed_expression_t const & expr, tchecker::process_id_t pid,
                         tchecker::variable_access_map_t & map)
{
  std::unordered_set<tchecker::clock_id_t> clock_ids;
  std::unordered_set<tchecker::intvar_id_t> intvar_ids;

  tchecker::extract_variables(expr, clock_ids, intvar_ids);

  for (tchecker::clock_id_t clock_id : clock_ids)
    map.add(clock_id, tchecker::VTYPE_CLOCK, tchecker::VACCESS_READ, pid);
  for (tchecker::intvar_id_t intvar_id : intvar_ids)
    map.add(intvar_id, tchecker::VTYPE_INTVAR, tchecker::VACCESS_READ, pid);
}